

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnView::initializeColumn(QColumnView *this,QAbstractItemView *column)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  DragDropMode behavior;
  EditTriggers actions;
  ScrollMode SVar4;
  SelectionBehavior behavior_00;
  SelectionMode mode;
  TextElideMode mode_00;
  _Rb_tree_node_base *p_Var5;
  QAbstractItemDelegate *pQVar6;
  _Base_ptr delegate;
  QAbstractItemDelegate *delegate_00;
  _Rb_tree_node_base *p_Var7;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  p_Var5 = (_Rb_tree_node_base *)0x0;
  QFrame::setFrameShape((QFrame *)column,NoFrame);
  QAbstractScrollArea::setHorizontalScrollBarPolicy
            ((QAbstractScrollArea *)column,ScrollBarAlwaysOff);
  QAbstractScrollArea::setVerticalScrollBarPolicy((QAbstractScrollArea *)column,ScrollBarAlwaysOn);
  QWidget::setMinimumWidth((QWidget *)column,100);
  QWidget::setAttribute((QWidget *)column,WA_MacShowFocusRect,false);
  behavior = QAbstractItemView::dragDropMode((QAbstractItemView *)this);
  QAbstractItemView::setDragDropMode((QAbstractItemView *)column,behavior);
  bVar3 = QAbstractItemView::dragDropOverwriteMode((QAbstractItemView *)this);
  QAbstractItemView::setDragDropOverwriteMode((QAbstractItemView *)column,bVar3);
  bVar3 = QAbstractItemView::showDropIndicator((QAbstractItemView *)this);
  QAbstractItemView::setDropIndicatorShown((QAbstractItemView *)column,bVar3);
  bVar3 = QAbstractItemView::alternatingRowColors((QAbstractItemView *)this);
  QAbstractItemView::setAlternatingRowColors((QAbstractItemView *)column,bVar3);
  bVar3 = QAbstractItemView::hasAutoScroll((QAbstractItemView *)this);
  QAbstractItemView::setAutoScroll((QAbstractItemView *)column,bVar3);
  actions = QAbstractItemView::editTriggers((QAbstractItemView *)this);
  QAbstractItemView::setEditTriggers((QAbstractItemView *)column,actions);
  SVar4 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  QAbstractItemView::setHorizontalScrollMode((QAbstractItemView *)column,SVar4);
  local_30 = QAbstractItemView::iconSize((QAbstractItemView *)this);
  QAbstractItemView::setIconSize((QAbstractItemView *)column,&local_30);
  behavior_00 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this);
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)column,behavior_00);
  mode = QAbstractItemView::selectionMode((QAbstractItemView *)this);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)column,mode);
  bVar3 = QAbstractItemView::tabKeyNavigation((QAbstractItemView *)this);
  QAbstractItemView::setTabKeyNavigation((QAbstractItemView *)column,bVar3);
  mode_00 = QAbstractItemView::textElideMode((QAbstractItemView *)this);
  QAbstractItemView::setTextElideMode((QAbstractItemView *)column,mode_00);
  SVar4 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  QAbstractItemView::setVerticalScrollMode((QAbstractItemView *)column,SVar4);
  QAbstractItemView::model((QAbstractItemView *)this);
  (**(code **)(*(long *)&(column->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1c8))
            (column);
  lVar2 = *(long *)(lVar1 + 0x310);
  if (lVar2 != 0) {
    p_Var5 = *(_Rb_tree_node_base **)(lVar2 + 0x20);
  }
  p_Var7 = (_Rb_tree_node_base *)(lVar2 + 0x10);
  if (lVar2 == 0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var5 != p_Var7; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((p_Var5[1]._M_parent == (_Base_ptr)0x0) || (*(int *)&(p_Var5[1]._M_parent)->field_0x4 == 0))
    {
      delegate = (_Base_ptr)0x0;
    }
    else {
      delegate = p_Var5[1]._M_left;
    }
    QAbstractItemView::setItemDelegateForRow
              ((QAbstractItemView *)column,p_Var5[1]._M_color,(QAbstractItemDelegate *)delegate);
  }
  pQVar6 = QAbstractItemView::itemDelegate((QAbstractItemView *)column);
  if ((*(long *)(lVar1 + 0x300) == 0) || (*(int *)(*(long *)(lVar1 + 0x300) + 4) == 0)) {
    delegate_00 = (QAbstractItemDelegate *)0x0;
  }
  else {
    delegate_00 = *(QAbstractItemDelegate **)(lVar1 + 0x308);
  }
  QAbstractItemView::setItemDelegate((QAbstractItemView *)column,delegate_00);
  if (pQVar6 != (QAbstractItemDelegate *)0x0) {
    (**(code **)(*(long *)pQVar6 + 0x20))(pQVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::initializeColumn(QAbstractItemView *column) const
{
    Q_D(const QColumnView);

    column->setFrameShape(QFrame::NoFrame);
    column->setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    column->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    column->setMinimumWidth(100);
    column->setAttribute(Qt::WA_MacShowFocusRect, false);

#if QT_CONFIG(draganddrop)
    column->setDragDropMode(dragDropMode());
    column->setDragDropOverwriteMode(dragDropOverwriteMode());
    column->setDropIndicatorShown(showDropIndicator());
#endif
    column->setAlternatingRowColors(alternatingRowColors());
    column->setAutoScroll(hasAutoScroll());
    column->setEditTriggers(editTriggers());
    column->setHorizontalScrollMode(horizontalScrollMode());
    column->setIconSize(iconSize());
    column->setSelectionBehavior(selectionBehavior());
    column->setSelectionMode(selectionMode());
    column->setTabKeyNavigation(tabKeyNavigation());
    column->setTextElideMode(textElideMode());
    column->setVerticalScrollMode(verticalScrollMode());

    column->setModel(model());

    // Copy the custom delegate per row
    for (auto i = d->rowDelegates.cbegin(), end = d->rowDelegates.cend(); i != end; ++i)
        column->setItemDelegateForRow(i.key(), i.value());

    // set the delegate to be the columnview delegate
    QAbstractItemDelegate *delegate = column->itemDelegate();
    column->setItemDelegate(d->itemDelegate);
    delete delegate;
}